

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

void __thiscall LinkedReadsDatastore::load_index(LinkedReadsDatastore *this,string *_filename)

{
  pointer __ptr;
  FILE *__stream;
  uint64_t uVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  runtime_error *prVar5;
  SDG_FILETYPE type;
  sdgVersion_t version;
  sdgMagic_t magic;
  uint64_t s;
  uint64_t sname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::_M_assign((string *)this);
  __stream = fopen((this->filename)._M_dataplus._M_p,"r");
  this->fd = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
    poVar2 = std::operator<<(poVar2,(string *)this);
    poVar2 = std::operator<<(poVar2,": ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                   "Could not open ",&this->filename);
    std::runtime_error::runtime_error(prVar5,(string *)&s);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fread(&magic,2,1,__stream);
  fread(&version,2,1,(FILE *)this->fd);
  fread(&type,2,1,(FILE *)this->fd);
  if (magic != 0x5d6) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                   "Magic number not present in ",_filename);
    std::runtime_error::runtime_error(prVar5,(string *)&s);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (version < 3) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_50,(uint)version);
    std::operator+(&local_90,"LinkedReadsDS file version: ",&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sname,
                   &local_90," is not compatible with ");
    std::__cxx11::to_string(&local_70,3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sname,
                   &local_70);
    std::runtime_error::runtime_error(prVar5,(string *)&s);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (type == 3) {
    sname = 0;
    fread(&sname,8,1,(FILE *)this->fd);
    uVar1 = sname;
    std::__cxx11::string::resize((ulong)&this->name);
    fread((this->name)._M_dataplus._M_p,1,uVar1,(FILE *)this->fd);
    fread(&this->readsize,8,1,(FILE *)this->fd);
    fread(&s,8,1,(FILE *)this->fd);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->read_tag,s);
    __ptr = (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start;
    fread(__ptr,4,(long)(this->read_tag).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)__ptr >> 2,(FILE *)this->fd);
    uVar1 = ftell((FILE *)this->fd);
    this->readpos_offset = uVar1;
    poVar2 = sdglib::OutputLog(INFO,true);
    poVar2 = std::operator<<(poVar2,"LinkedReadsDatastore open: ");
    poVar2 = std::operator<<(poVar2,(string *)_filename);
    poVar2 = std::operator<<(poVar2,"  max read length: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," Total reads: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_90,(uint)type);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sname,
                 "File type supplied: ",&local_90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sname,
                 " is not compatible with LinkedDS_FT");
  std::runtime_error::runtime_error(prVar5,(string *)&s);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LinkedReadsDatastore::load_index(std::string _filename){
    uint64_t s;
    filename=_filename;
    fd=fopen(filename.c_str(),"r");
    if (!fd) {
        std::cerr << "Failed to open " << filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + filename);
    }
    sdgMagic_t magic;
    sdgVersion_t version;
    SDG_FILETYPE type;
    fread((char *) &magic, sizeof(magic),1,fd);
    fread((char *) &version, sizeof(version),1,fd);
    fread((char *) &type, sizeof(type),1,fd);

    if (magic != SDG_MAGIC) {
        throw std::runtime_error("Magic number not present in " + _filename);
    }

    if (version < min_compat) {
        throw std::runtime_error("LinkedReadsDS file version: " + std::to_string(version) + " is not compatible with " + std::to_string(min_compat));
    }

    if (type != LinkedDS_FT) {
        throw std::runtime_error("File type supplied: " + std::to_string(type) + " is not compatible with LinkedDS_FT");
    }

    uint64_t sname=0;
    fread( &sname, sizeof(sname), 1, fd);
    name.resize(sname);
    fread( (char *) name.data(), sizeof(char), sname, fd);

    fread( &readsize,sizeof(readsize),1,fd);
    fread(&s,sizeof(s),1,fd); read_tag.resize(s);
    fread(read_tag.data(),sizeof(read_tag[0]),read_tag.size(),fd);
    readpos_offset=ftell(fd);
    sdglib::OutputLog()<<"LinkedReadsDatastore open: "<<_filename<<"  max read length: "<<readsize<<" Total reads: " <<size()<<std::endl;
}